

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcpy_s.c
# Opt level: O2

int main(void)

{
  errno_t eVar1;
  char s [6];
  
  builtin_strncpy(s,"xxxxx",6);
  set_constraint_handler_s(test_handler);
  eVar1 = strcpy_s(s,6,"");
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcpy_s.c, line %d - %s\n"
           ,0x45,"strcpy_s( s, 6, \"\" ) == 0");
  }
  if (s[0] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcpy_s.c, line %d - %s\n"
           ,0x46,"s[0] == \'\\0\'");
  }
  if (s[1] != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcpy_s.c, line %d - %s\n"
           ,0x47,"s[1] == \'x\'");
  }
  eVar1 = strcpy_s(s,6,"abcde");
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcpy_s.c, line %d - %s\n"
           ,0x48,"strcpy_s( s, 6, abcde ) == 0");
  }
  if (s[0] != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcpy_s.c, line %d - %s\n"
           ,0x49,"s[0] == \'a\'");
  }
  if (s[4] != 'e') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcpy_s.c, line %d - %s\n"
           ,0x4a,"s[4] == \'e\'");
  }
  if (s[5] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcpy_s.c, line %d - %s\n"
           ,0x4b,"s[5] == \'\\0\'");
  }
  eVar1 = strcpy_s(s,6,"abcdef");
  if (eVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcpy_s.c, line %d - %s\n"
           ,0x4e,"strcpy_s( s, 6, \"abcdef\" ) != 0");
  }
  eVar1 = strcpy_s(s,3,s + 2);
  if (eVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcpy_s.c, line %d - %s\n"
           ,0x51,"strcpy_s( s, 3, s + 2 ) != 0");
  }
  eVar1 = strcpy_s(s + 2,3,s);
  if (eVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcpy_s.c, line %d - %s\n"
           ,0x52,"strcpy_s( s + 2, 3, s ) != 0");
  }
  if (HANDLER_CALLS != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcpy_s.c, line %d - %s\n"
           ,0x54,"HANDLER_CALLS == 3");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#if ! defined( REGTEST ) || defined( __STDC_LIB_EXT1__ )
    char s[] = "xxxxx";
    set_constraint_handler_s( test_handler );

    TESTCASE( strcpy_s( s, 6, "" ) == 0 );
    TESTCASE( s[0] == '\0' );
    TESTCASE( s[1] == 'x' );
    TESTCASE( strcpy_s( s, 6, abcde ) == 0 );
    TESTCASE( s[0] == 'a' );
    TESTCASE( s[4] == 'e' );
    TESTCASE( s[5] == '\0' );

    /* Overrun. */
    TESTCASE( strcpy_s( s, 6, "abcdef" ) != 0 );

    /* Overlapping. */
    TESTCASE( strcpy_s( s, 3, s + 2 ) != 0 );
    TESTCASE( strcpy_s( s + 2, 3, s ) != 0 );

    TESTCASE( HANDLER_CALLS == 3 );
#endif
    return TEST_RESULTS;
}